

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O0

void __thiscall r_exec::AntiPGMController::reduce(AntiPGMController *this,View *input)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  P<r_exec::Overlay> *pPVar4;
  Overlay *pOVar5;
  undefined4 extraout_var;
  P *this_00;
  iterator iVar6;
  const_iterator cVar7;
  P<r_exec::Overlay> local_90;
  P<r_exec::Overlay> local_88;
  Overlay *local_80;
  Overlay *overlay;
  Overlay *offspring;
  list<core::P<r_exec::Overlay>_> *local_68;
  iterator local_60;
  iterator local_50 [2];
  undefined1 local_30 [8];
  const_iterator o;
  lock_guard<std::mutex> guard;
  View *input_local;
  AntiPGMController *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&o._list,
             &(this->super__PGMController).super_OController.super_Controller.m_reductionMutex);
  r_code::list<core::P<r_exec::Overlay>_>::const_iterator::const_iterator
            ((const_iterator *)local_30);
  local_50[0] = r_code::list<core::P<r_exec::Overlay>_>::begin
                          (&(this->super__PGMController).super_OController.overlays);
  r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator=
            ((const_iterator *)local_30,local_50);
LAB_0029440d:
  do {
    iVar6 = r_code::list<core::P<r_exec::Overlay>_>::end
                      (&(this->super__PGMController).super_OController.overlays);
    local_60 = iVar6;
    bVar1 = r_code::list<core::P<r_exec::Overlay>_>::_iterator::operator!=
                      ((_iterator *)local_30,&local_60.super__iterator);
    if (!bVar1) {
LAB_002946aa:
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&o._list);
      return;
    }
    pPVar4 = r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator*
                       ((const_iterator *)local_30);
    pOVar5 = core::P<r_exec::Overlay>::operator->(pPVar4);
    uVar2 = (*(pOVar5->super__Object)._vptr__Object[4])();
    if ((uVar2 & 1) == 0) {
      pPVar4 = r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator*
                         ((const_iterator *)local_30);
      pOVar5 = core::P<r_exec::Overlay>::operator->(pPVar4);
      iVar3 = (*(pOVar5->super__Object)._vptr__Object[3])(pOVar5,input);
      overlay = (Overlay *)CONCAT44(extraout_var,iVar3);
      if (((this->super__PGMController).field_0x99 & 1) != 0) {
        this_00 = (P *)r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator*
                                 ((const_iterator *)local_30);
        local_80 = core::P::operator_cast_to_Overlay_(this_00);
        (*(local_80->super__Object)._vptr__Object[2])();
        r_code::list<core::P<r_exec::Overlay>_>::clear
                  (&(this->super__PGMController).super_OController.overlays);
        core::P<r_exec::Overlay>::P(&local_88,local_80);
        r_code::list<core::P<r_exec::Overlay>_>::push_back
                  (&(this->super__PGMController).super_OController.overlays,&local_88);
        core::P<r_exec::Overlay>::~P(&local_88);
        (this->super__PGMController).field_0x99 = 0;
        goto LAB_002946aa;
      }
      r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator++
                ((const_iterator *)local_30);
      if (overlay != (Overlay *)0x0) {
        core::P<r_exec::Overlay>::P(&local_90,overlay);
        r_code::list<core::P<r_exec::Overlay>_>::push_front
                  (&(this->super__PGMController).super_OController.overlays,&local_90);
        core::P<r_exec::Overlay>::~P(&local_90);
      }
      goto LAB_0029440d;
    }
    cVar7 = r_code::list<core::P<r_exec::Overlay>_>::erase
                      (&(this->super__PGMController).super_OController.overlays,
                       (const_iterator *)local_30);
    local_68 = cVar7._list;
    offspring = (Overlay *)cVar7.super__iterator._cell;
    r_code::list<core::P<r_exec::Overlay>_>::const_iterator::operator=
              ((const_iterator *)local_30,(const_iterator *)&offspring);
  } while( true );
}

Assistant:

void AntiPGMController::reduce(r_exec::View *input)
{
    std::lock_guard<std::mutex> guard(m_reductionMutex);
    r_code::list<P<Overlay> >::const_iterator o;

    for (o = overlays.begin(); o != overlays.end();) {
        if ((*o)->is_invalidated()) {
            o = overlays.erase(o);
        } else {
            Overlay *offspring = (*o)->reduce_view(input);

            if (successful_match) { // the controller has been restarted: reset the overlay and kill all others
                Overlay *overlay = *o;
                overlay->reset();
                overlays.clear();
                overlays.push_back(overlay);
                successful_match = false;
                break;
            }

            ++o;

            if (offspring) {
                overlays.push_front(offspring);
            }
        }
    }
}